

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>>>
::find_soo<std::__cxx11::string>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>>>
           *this,key_arg<std::__cxx11::basic_string<char>_> *key)

{
  bool bVar1;
  slot_type *slot;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>
  *ts;
  iterator iVar2;
  EqualElement<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  key_arg<std::__cxx11::basic_string<char>_> *local_28;
  key_arg<std::__cxx11::basic_string<char>_> *key_local;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>_>_>
  *this_local;
  
  local_28 = key;
  key_local = (key_arg<std::__cxx11::basic_string<char>_> *)this;
  bVar1 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>_>_>
          ::is_soo((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>_>_>
                    *)this);
  if (!bVar1) {
    __assert_fail("(is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe21,
                  "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::unique_ptr<google::protobuf::FeatureSet>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, std::unique_ptr<google::protobuf::FeatureSet>>>>::find_soo(const key_arg<K> &) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::unique_ptr<google::protobuf::FeatureSet>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, std::unique_ptr<google::protobuf::FeatureSet>>>, K = std::basic_string<char>]"
                 );
  }
  bVar1 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>_>_>
          ::empty((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>_>_>
                   *)this);
  if (!bVar1) {
    local_38.rhs = local_28;
    local_38.eq = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>_>_>
                  ::eq_ref((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>_>_>
                            *)this);
    slot = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>_>_>
           ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>_>_>
                       *)this);
    ts = common_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>,void>
         ::
         element<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>>
                   ((remove_const_t<slot_type>_conflict12 *)slot);
    bVar1 = hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>,void>
            ::
            apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>>>::EqualElement<std::__cxx11::string>,std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>&,absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>>
                      (&local_38,ts);
    if (bVar1) {
      iVar2 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>_>_>
              ::soo_iterator((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>_>_>
                              *)this);
      return iVar2;
    }
  }
  iVar2 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>_>_>
          ::end((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>_>_>
                 *)this);
  return iVar2;
}

Assistant:

iterator find_soo(const key_arg<K>& key) {
    ABSL_SWISSTABLE_ASSERT(is_soo());
    return empty() || !PolicyTraits::apply(EqualElement<K>{key, eq_ref()},
                                           PolicyTraits::element(soo_slot()))
               ? end()
               : soo_iterator();
  }